

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O0

void __thiscall
rangeless::mt::
synchronized_queue<rangeless::fn::impl::maybe<long>,_rangeless::mt::lockables::atomic_mutex>::
synchronized_queue(synchronized_queue<rangeless::fn::impl::maybe<long>,_rangeless::mt::lockables::atomic_mutex>
                   *this,size_t cap)

{
  synchronized_queue<rangeless::fn::impl::maybe<long>,_rangeless::mt::lockables::atomic_mutex>
  *local_58;
  char *local_30;
  size_t cap_local;
  synchronized_queue<rangeless::fn::impl::maybe<long>,_rangeless::mt::lockables::atomic_mutex>
  *this_local;
  
  (this->push).m_queue = this;
  (this->pop).m_queue = this;
  local_30 = this->m_padding0;
  do {
    *local_30 = '\0';
    local_30 = local_30 + 1;
  } while ((uint32_t *)local_30 != &this->m_num_waiting_to_push);
  this->m_num_waiting_to_push = 0;
  this->m_num_waiting_to_pop = 0;
  this->m_capacity = cap;
  std::
  queue<rangeless::fn::impl::maybe<long>,std::deque<rangeless::fn::impl::maybe<long>,std::allocator<rangeless::fn::impl::maybe<long>>>>
  ::
  queue<std::deque<rangeless::fn::impl::maybe<long>,std::allocator<rangeless::fn::impl::maybe<long>>>,void>
            ((queue<rangeless::fn::impl::maybe<long>,std::deque<rangeless::fn::impl::maybe<long>,std::allocator<rangeless::fn::impl::maybe<long>>>>
              *)&this->m_queue);
  (this->m_queue_mutex).m_locked._M_base._M_i = false;
  lockables::atomic_mutex::atomic_mutex(&this->m_queue_mutex);
  (this->m_push_mutex).m_locked._M_base._M_i = false;
  lockables::atomic_mutex::atomic_mutex(&this->m_push_mutex);
  (this->m_pop_mutex).m_locked._M_base._M_i = false;
  lockables::atomic_mutex::atomic_mutex(&this->m_pop_mutex);
  std::_V2::condition_variable_any::condition_variable_any(&this->m_can_push);
  std::_V2::condition_variable_any::condition_variable_any(&this->m_can_pop);
  local_58 = (synchronized_queue<rangeless::fn::impl::maybe<long>,_rangeless::mt::lockables::atomic_mutex>
              *)this->m_padding1;
  do {
    *(char *)&(local_58->push).m_queue = '\0';
    local_58 = (synchronized_queue<rangeless::fn::impl::maybe<long>,_rangeless::mt::lockables::atomic_mutex>
                *)((long)&(local_58->push).m_queue + 1);
  } while (local_58 != this + 1);
  return;
}

Assistant:

synchronized_queue(size_t cap = 1024)
      : m_capacity{ cap }
    {}